

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

bool flatbuffers::anon_unknown_94::VerifyObject
               (Verifier *v,Schema *schema,Object *obj,Table *table,bool required)

{
  voffset_t elem_off;
  bool bVar1;
  uchar utype;
  return_type utype_00;
  uint16_t uVar2;
  BaseType BVar3;
  int32_t iVar4;
  int32_t iVar5;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar6;
  return_type this;
  Type *pTVar7;
  Vector<signed_char,_unsigned_int> *vec;
  String *str;
  Table *pTVar8;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar9;
  char *pcVar10;
  return_type pOVar11;
  Vector<short,_unsigned_int> *vec_00;
  Vector<int,_unsigned_int> *vec_01;
  Vector<long,_unsigned_int> *vec_02;
  Vector<double,_unsigned_int> *vec_03;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_04;
  Vector<float,_unsigned_int> *vec_05;
  uchar *vec_06;
  Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int> *vec_07;
  Vector<unsigned_char,_unsigned_int> *pVVar12;
  return_type elem;
  Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *vec_08;
  return_type table_00;
  int __c;
  int __c_00;
  uint i;
  Verifier *__s;
  bool bVar13;
  uoffset_t j;
  uint uVar14;
  
  if (table == (Table *)0x0) {
    bVar13 = !required;
  }
  else {
    bVar1 = VerifierTemplate<false>::VerifyTableStart(v,(uint8_t *)table);
    i = 0;
    bVar13 = false;
    if (bVar1) {
      for (; pVVar6 = reflection::Object::fields(obj), i < *(uint *)pVVar6; i = i + 1) {
        pVVar6 = reflection::Object::fields(obj);
        pcVar10 = (char *)(ulong)i;
        this = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get(pVVar6,i);
        pTVar7 = reflection::Field::type(this);
        BVar3 = reflection::Type::base_type(pTVar7);
        switch(BVar3) {
        case None:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                        ,0xb2,
                        "bool flatbuffers::(anonymous namespace)::VerifyObject(flatbuffers::Verifier &, const reflection::Schema &, const reflection::Object &, const flatbuffers::Table *, bool)"
                       );
        case UType:
          uVar2 = reflection::Field::offset(this);
          bVar13 = Table::VerifyField<unsigned_char>(table,v,uVar2,1);
          break;
        case Bool:
        case Byte:
        case UByte:
          uVar2 = reflection::Field::offset(this);
          bVar13 = Table::VerifyField<signed_char>(table,v,uVar2,1);
          break;
        case Short:
        case UShort:
          uVar2 = reflection::Field::offset(this);
          bVar13 = Table::VerifyField<short>(table,v,uVar2,2);
          break;
        case Int:
        case UInt:
          uVar2 = reflection::Field::offset(this);
          bVar13 = Table::VerifyField<int>(table,v,uVar2,4);
          break;
        case Long:
        case ULong:
          uVar2 = reflection::Field::offset(this);
          bVar13 = Table::VerifyField<long>(table,v,uVar2,8);
          break;
        case Float:
          uVar2 = reflection::Field::offset(this);
          bVar13 = Table::VerifyField<float>(table,v,uVar2,4);
          break;
        case Double:
          uVar2 = reflection::Field::offset(this);
          bVar13 = Table::VerifyField<double>(table,v,uVar2,8);
          break;
        case String:
          uVar2 = reflection::Field::offset(this);
          bVar13 = Table::VerifyField<unsigned_int>(table,v,uVar2,4);
          if (!bVar13) {
            return false;
          }
          str = GetFieldS(table,this);
          bVar13 = VerifierTemplate<false>::VerifyString(v,str);
          break;
        case Vector:
          pTVar7 = reflection::Field::type(this);
          BVar3 = reflection::Type::base_type(pTVar7);
          if (BVar3 != Vector) {
            __assert_fail("vec_field.type()->base_type() == reflection::Vector",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                          ,0x5e,
                          "bool flatbuffers::(anonymous namespace)::VerifyVector(flatbuffers::Verifier &, const reflection::Schema &, const flatbuffers::Table &, const reflection::Field &)"
                         );
          }
          uVar2 = reflection::Field::offset(this);
          __s = v;
          bVar13 = Table::VerifyField<unsigned_int>(table,v,uVar2,4);
          if (!bVar13) {
            return false;
          }
          pTVar7 = reflection::Field::type(this);
          BVar3 = reflection::Type::element(pTVar7);
          switch(BVar3) {
          case UType:
            pVVar12 = GetFieldV<unsigned_char>(table,this);
            bVar13 = VerifierTemplate<false>::VerifyVector<unsigned_char,_unsigned_int>(v,pVVar12);
            break;
          case Bool:
          case Byte:
          case UByte:
            vec = GetFieldV<signed_char>(table,this);
            bVar13 = VerifierTemplate<false>::VerifyVector<signed_char,_unsigned_int>(v,vec);
            break;
          case Short:
          case UShort:
            vec_00 = GetFieldV<short>(table,this);
            bVar13 = VerifierTemplate<false>::VerifyVector<short,_unsigned_int>(v,vec_00);
            break;
          case Int:
          case UInt:
            vec_01 = GetFieldV<int>(table,this);
            bVar13 = VerifierTemplate<false>::VerifyVector<int,_unsigned_int>(v,vec_01);
            break;
          case Long:
          case ULong:
            vec_02 = GetFieldV<long>(table,this);
            bVar13 = VerifierTemplate<false>::VerifyVector<long,_unsigned_int>(v,vec_02);
            break;
          case Float:
            vec_05 = GetFieldV<float>(table,this);
            bVar13 = VerifierTemplate<false>::VerifyVector<float,_unsigned_int>(v,vec_05);
            break;
          case Double:
            vec_03 = GetFieldV<double>(table,this);
            bVar13 = VerifierTemplate<false>::VerifyVector<double,_unsigned_int>(v,vec_03);
            break;
          case String:
            vec_04 = GetFieldV<flatbuffers::Offset<flatbuffers::String>>(table,this);
            bVar13 = VerifierTemplate<false>::
                     VerifyVector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>(v,vec_04);
            if (!bVar13) {
              return false;
            }
            bVar13 = VerifierTemplate<false>::VerifyVectorOfStrings(v,vec_04);
            break;
          default:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                          ,0xa5,
                          "bool flatbuffers::(anonymous namespace)::VerifyVector(flatbuffers::Verifier &, const reflection::Schema &, const flatbuffers::Table &, const reflection::Field &)"
                         );
          case Obj:
            pVVar9 = reflection::Schema::objects(schema);
            pTVar7 = reflection::Field::type(this);
            pcVar10 = reflection::Type::index(pTVar7,(char *)__s,__c_00);
            pOVar11 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                                (pVVar9,(uint)pcVar10);
            bVar13 = reflection::Object::is_struct(pOVar11);
            if (bVar13) {
              uVar2 = reflection::Field::offset(this);
              bVar13 = reflection::Field::required(this);
              vec_06 = Table::GetPointer<unsigned_char_const*,unsigned_int>(table,uVar2);
              if (vec_06 != (uchar *)0x0) {
                iVar4 = reflection::Object::bytesize(pOVar11);
                bVar13 = VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                   (v,vec_06,(long)iVar4,(size_t *)0x0);
                goto LAB_0013bfdc;
              }
              if (bVar13) {
                return false;
              }
            }
            else {
              vec_08 = GetFieldV<flatbuffers::Offset<flatbuffers::Table>>(table,this);
              bVar13 = VerifierTemplate<false>::
                       VerifyVector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>(v,vec_08)
              ;
              if (!bVar13) {
                return false;
              }
              if (vec_08 != (Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *)0x0) {
                uVar14 = 0;
                while (uVar14 < *(uint *)vec_08) {
                  table_00 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::Get
                                       (vec_08,uVar14);
                  bVar13 = VerifyObject(v,schema,pOVar11,table_00,true);
                  uVar14 = uVar14 + 1;
                  if (!bVar13) {
                    return false;
                  }
                }
              }
            }
            goto LAB_0013c342;
          case Union:
            vec_07 = GetFieldV<flatbuffers::Offset<unsigned_char>>(table,this);
            bVar13 = VerifierTemplate<false>::
                     VerifyVector<flatbuffers::Offset<unsigned_char>,_unsigned_int>(v,vec_07);
            if (!bVar13) {
              return false;
            }
            if (vec_07 != (Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int> *)0x0) {
              uVar2 = reflection::Field::offset(this);
              pVVar12 = Table::
                        GetPointer<flatbuffers::Vector<unsigned_char,unsigned_int>*,unsigned_int>
                                  (table,uVar2 - 2);
              bVar13 = VerifierTemplate<false>::VerifyVector<unsigned_char,_unsigned_int>(v,pVVar12)
              ;
              uVar14 = 0;
              if (!bVar13) {
                return false;
              }
              while (uVar14 < *(uint *)vec_07) {
                utype_00 = Vector<unsigned_char,_unsigned_int>::Get(pVVar12,uVar14);
                elem = Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int>::Get(vec_07,uVar14);
                bVar13 = VerifyUnion(v,schema,utype_00,elem,this);
                uVar14 = uVar14 + 1;
                if (!bVar13) {
                  return false;
                }
              }
            }
            goto LAB_0013c342;
          }
          break;
        case Obj:
          pVVar9 = reflection::Schema::objects(schema);
          pTVar7 = reflection::Field::type(this);
          pcVar10 = reflection::Type::index(pTVar7,pcVar10,__c);
          pOVar11 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                              (pVVar9,(uint)pcVar10);
          bVar13 = reflection::Object::is_struct(pOVar11);
          if (bVar13) {
            uVar2 = reflection::Field::offset(this);
            bVar13 = reflection::Field::required(this);
            if ((*(ushort *)(table + -(long)*(int *)table) <= uVar2) ||
               (elem_off = *(voffset_t *)(table + ((ulong)uVar2 - (long)*(int *)table)),
               elem_off == 0)) {
              if (bVar13) {
                return false;
              }
              goto LAB_0013c342;
            }
            iVar4 = reflection::Object::bytesize(pOVar11);
            iVar5 = reflection::Object::minalign(pOVar11);
            bVar13 = VerifierTemplate<false>::VerifyFieldStruct
                               (v,(uint8_t *)table,elem_off,(long)iVar4,(long)iVar5);
          }
          else {
            pTVar8 = GetFieldT(table,this);
            bVar13 = reflection::Field::required(this);
            bVar13 = VerifyObject(v,schema,pOVar11,pTVar8,bVar13);
          }
          break;
        case Union:
          uVar2 = reflection::Field::offset(this);
          utype = Table::GetField<unsigned_char>(table,uVar2 - 2,'\0');
          pTVar8 = GetFieldT(table,this);
          bVar13 = VerifyUnion(v,schema,utype,(uint8_t *)pTVar8,this);
LAB_0013bfdc:
          if (bVar13 == false) {
            return false;
          }
          goto LAB_0013c342;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                        ,0xfb,
                        "bool flatbuffers::(anonymous namespace)::VerifyObject(flatbuffers::Verifier &, const reflection::Schema &, const reflection::Object &, const flatbuffers::Table *, bool)"
                       );
        }
        if (bVar13 == false) {
          return false;
        }
LAB_0013c342:
      }
      v->depth_ = v->depth_ - 1;
      bVar13 = true;
    }
  }
  return bVar13;
}

Assistant:

static bool VerifyObject(flatbuffers::Verifier &v,
                         const reflection::Schema &schema,
                         const reflection::Object &obj,
                         const flatbuffers::Table *table, bool required) {
  if (!table) return !required;
  if (!table->VerifyTableStart(v)) return false;
  for (uoffset_t i = 0; i < obj.fields()->size(); i++) {
    auto field_def = obj.fields()->Get(i);
    switch (field_def->type()->base_type()) {
      case reflection::None: FLATBUFFERS_ASSERT(false); break;
      case reflection::UType:
        if (!table->VerifyField<uint8_t>(v, field_def->offset(),
                                         sizeof(uint8_t)))
          return false;
        break;
      case reflection::Bool:
      case reflection::Byte:
      case reflection::UByte:
        if (!table->VerifyField<int8_t>(v, field_def->offset(), sizeof(int8_t)))
          return false;
        break;
      case reflection::Short:
      case reflection::UShort:
        if (!table->VerifyField<int16_t>(v, field_def->offset(),
                                         sizeof(int16_t)))
          return false;
        break;
      case reflection::Int:
      case reflection::UInt:
        if (!table->VerifyField<int32_t>(v, field_def->offset(),
                                         sizeof(int32_t)))
          return false;
        break;
      case reflection::Long:
      case reflection::ULong:
        if (!table->VerifyField<int64_t>(v, field_def->offset(),
                                         sizeof(int64_t)))
          return false;
        break;
      case reflection::Float:
        if (!table->VerifyField<float>(v, field_def->offset(), sizeof(float)))
          return false;
        break;
      case reflection::Double:
        if (!table->VerifyField<double>(v, field_def->offset(), sizeof(double)))
          return false;
        break;
      case reflection::String:
        if (!table->VerifyField<uoffset_t>(v, field_def->offset(),
                                           sizeof(uoffset_t)) ||
            !v.VerifyString(flatbuffers::GetFieldS(*table, *field_def))) {
          return false;
        }
        break;
      case reflection::Vector:
        if (!VerifyVector(v, schema, *table, *field_def)) return false;
        break;
      case reflection::Obj: {
        auto child_obj = schema.objects()->Get(field_def->type()->index());
        if (child_obj->is_struct()) {
          if (!VerifyStruct(v, *table, field_def->offset(), *child_obj,
                            field_def->required())) {
            return false;
          }
        } else {
          if (!VerifyObject(v, schema, *child_obj,
                            flatbuffers::GetFieldT(*table, *field_def),
                            field_def->required())) {
            return false;
          }
        }
        break;
      }
      case reflection::Union: {
        //  get union type from the prev field
        voffset_t utype_offset = field_def->offset() - sizeof(voffset_t);
        auto utype = table->GetField<uint8_t>(utype_offset, 0);
        auto uval = reinterpret_cast<const uint8_t *>(
            flatbuffers::GetFieldT(*table, *field_def));
        if (!VerifyUnion(v, schema, utype, uval, *field_def)) { return false; }
        break;
      }
      default: FLATBUFFERS_ASSERT(false); break;
    }
  }

  if (!v.EndTable()) return false;

  return true;
}